

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O3

ProtoElement * __thiscall
google::protobuf::util::converter::ProtoWriter::ProtoElement::pop(ProtoElement *this)

{
  int *piVar1;
  ProtoWriter *pPVar2;
  undefined8 uVar3;
  size_t size;
  CodedOutputStream *this_00;
  SizeInfo *pSVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  int64 iVar7;
  undefined4 extraout_var;
  long *plVar8;
  ProtoElement *pPVar9;
  ulong uVar10;
  _Elt_pointer pSVar11;
  uint uVar12;
  LocationTrackerInterface *pLVar13;
  long lVar14;
  ulong uVar15;
  
  if (this->proto3_ == false) {
    for (p_Var6 = (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(this->required_fields_)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      pPVar2 = this->ow_;
      uVar3 = **(undefined8 **)(*(long *)(p_Var6 + 1) + 0x28);
      size = (*(undefined8 **)(*(long *)(p_Var6 + 1) + 0x28))[1];
      if ((long)size < 0) {
        StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
      }
      pPVar9 = (pPVar2->element_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
               ._M_head_impl;
      if (pPVar9 == (ProtoElement *)0x0) {
        pLVar13 = (pPVar2->tracker_)._M_t.
                  super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                  .
                  super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
                  ._M_head_impl;
      }
      else {
        pLVar13 = &pPVar9->super_LocationTrackerInterface;
      }
      (*pPVar2->listener_->_vptr_ErrorListener[4])(pPVar2->listener_,pLVar13,uVar3,size);
    }
  }
  if (this->size_index_ < 0) goto LAB_003114db;
  this_00 = (this->ow_->stream_)._M_t.
            super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
            .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
  iVar7 = io::EpsCopyOutputStream::ByteCount(&this_00->impl_,this_00->cur_);
  iVar5 = (int)iVar7 - (int)this_00->start_count_;
  pPVar2 = this->ow_;
  pSVar11 = (pPVar2->size_insert_).
            super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar10 = ((long)pSVar11 -
            (long)(pPVar2->size_insert_).
                  super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + (long)this->size_index_;
  if ((long)uVar10 < 0) {
    uVar15 = (long)uVar10 >> 6;
LAB_00311439:
    pSVar4 = (pPVar2->size_insert_).
             super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar15];
    piVar1 = &pSVar4[(uint)uVar10 & 0x3f].size;
    *piVar1 = *piVar1 + iVar5;
    pSVar11 = pSVar4 + uVar10 + uVar15 * -0x40;
  }
  else {
    if (0x3f < uVar10) {
      uVar15 = uVar10 >> 6;
      goto LAB_00311439;
    }
    pSVar11 = pSVar11 + this->size_index_;
    pSVar11->size = pSVar11->size + iVar5;
  }
  uVar12 = pSVar11->size;
  iVar5 = (*(this->super_BaseElement)._vptr_BaseElement[2])(this);
  plVar8 = (long *)CONCAT44(extraout_var,iVar5);
  if (plVar8 != (long *)0x0) {
    uVar12 = uVar12 | 1;
    iVar5 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    do {
      lVar14 = (long)(int)plVar8[0xf];
      if (-1 < lVar14) {
        pPVar2 = this->ow_;
        pSVar11 = (pPVar2->size_insert_).
                  super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar10 = ((long)pSVar11 -
                  (long)(pPVar2->size_insert_).
                        super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + lVar14;
        if ((long)uVar10 < 0) {
          uVar15 = (long)uVar10 >> 6;
LAB_003114b7:
          pSVar11 = (pPVar2->size_insert_).
                    super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node[uVar15] +
                    uVar10 + uVar15 * -0x40;
        }
        else {
          if (0x3f < uVar10) {
            uVar15 = uVar10 >> 6;
            goto LAB_003114b7;
          }
          pSVar11 = pSVar11 + lVar14;
        }
        pSVar11->size = pSVar11->size + (iVar5 * 9 + 0x49U >> 6);
      }
      plVar8 = (long *)(**(code **)(*plVar8 + 0x10))(plVar8);
    } while (plVar8 != (long *)0x0);
  }
LAB_003114db:
  pPVar9 = StructuredObjectWriter::BaseElement::
           pop<google::protobuf::util::converter::ProtoWriter::ProtoElement>
                     (&this->super_BaseElement);
  return pPVar9;
}

Assistant:

ProtoWriter::ProtoElement* ProtoWriter::ProtoElement::pop() {
  if (!proto3_) {
    // Calls the registered error listener for any required field(s) not yet
    // seen.
    for (std::set<const google::protobuf::Field*>::iterator it =
             required_fields_.begin();
         it != required_fields_.end(); ++it) {
      ow_->MissingField((*it)->name());
    }
  }
  // Computes the total number of proto bytes used by a message, also adjusts
  // the size of all parent messages by the length of this size field.
  // If size_index_ < 0, this is not a message, so no size field is added.
  if (size_index_ >= 0) {
    // Add the final buffer position to compute the total length of this
    // serialized message. The stored value (before this addition) already
    // contains the total length of the size fields of all nested messages
    // minus the initial buffer position.
    ow_->size_insert_[size_index_].size += ow_->stream_->ByteCount();
    // Calculate the length required to serialize the size field of the
    // message, and propagate this additional size information upward to
    // all enclosing messages.
    int size = ow_->size_insert_[size_index_].size;
    int length = CodedOutputStream::VarintSize32(size);
    for (ProtoElement* e = parent(); e != nullptr; e = e->parent()) {
      // Only nested messages have size field, lists do not have size field.
      if (e->size_index_ >= 0) {
        ow_->size_insert_[e->size_index_].size += length;
      }
    }
  }
  return BaseElement::pop<ProtoElement>();
}